

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

void Saig_ManWindowInsertBig_rec
               (Aig_Man_t *pNew,Aig_Obj_t *pObjBig,Vec_Ptr_t *vBigNode2SmallPo,
               Vec_Ptr_t *vSmallPi2BigNode)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pMatch;
  Vec_Ptr_t *vSmallPi2BigNode_local;
  Vec_Ptr_t *vBigNode2SmallPo_local;
  Aig_Obj_t *pObjBig_local;
  Aig_Man_t *pNew_local;
  
  if ((pObjBig->field_5).pData == (void *)0x0) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vBigNode2SmallPo,pObjBig->Id);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsNode(pObjBig);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObjBig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x130,
                      "void Saig_ManWindowInsertBig_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      pAVar2 = Aig_ObjFanin0(pObjBig);
      Saig_ManWindowInsertBig_rec(pNew,pAVar2,vBigNode2SmallPo,vSmallPi2BigNode);
      pAVar2 = Aig_ObjFanin1(pObjBig);
      Saig_ManWindowInsertBig_rec(pNew,pAVar2,vBigNode2SmallPo,vSmallPi2BigNode);
      pAVar2 = Aig_ObjChild0Copy(pObjBig);
      pAVar3 = Aig_ObjChild1Copy(pObjBig);
      pAVar2 = Aig_And(pNew,pAVar2,pAVar3);
      (pObjBig->field_5).pData = pAVar2;
    }
    else {
      pAVar3 = Aig_ObjFanin0(pAVar2);
      Saig_ManWindowInsertSmall_rec(pNew,pAVar3,vBigNode2SmallPo,vSmallPi2BigNode);
      pAVar2 = Aig_ObjChild0Copy(pAVar2);
      (pObjBig->field_5).pData = pAVar2;
    }
  }
  return;
}

Assistant:

void Saig_ManWindowInsertBig_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjBig, 
         Vec_Ptr_t * vBigNode2SmallPo, Vec_Ptr_t * vSmallPi2BigNode )
{
    Aig_Obj_t * pMatch;
    if ( pObjBig->pData )
        return;
    if ( (pMatch = (Aig_Obj_t *)Vec_PtrEntry( vBigNode2SmallPo, pObjBig->Id )) )
    {
        Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin0(pMatch), vBigNode2SmallPo, vSmallPi2BigNode );
        pObjBig->pData = Aig_ObjChild0Copy(pMatch);
        return;        
    }
    assert( Aig_ObjIsNode(pObjBig) );
    Saig_ManWindowInsertBig_rec( pNew, Aig_ObjFanin0(pObjBig), vBigNode2SmallPo, vSmallPi2BigNode );
    Saig_ManWindowInsertBig_rec( pNew, Aig_ObjFanin1(pObjBig), vBigNode2SmallPo, vSmallPi2BigNode );
    pObjBig->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObjBig), Aig_ObjChild1Copy(pObjBig) );
}